

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Cluster::GetFirst(Cluster *this,BlockEntry **pFirst)

{
  long lVar1;
  long len;
  longlong pos;
  long local_20;
  longlong local_18;
  
  if (this->m_entries_count < 1) {
    lVar1 = Parse(this,&local_18,&local_20);
    if (-1 < lVar1) {
      if (0 < this->m_entries_count) goto LAB_00155f96;
      lVar1 = 0;
    }
    *pFirst = (BlockEntry *)0x0;
  }
  else {
LAB_00155f96:
    *pFirst = *this->m_entries;
    lVar1 = 0;
  }
  return lVar1;
}

Assistant:

long Cluster::GetFirst(const BlockEntry*& pFirst) const {
  if (m_entries_count <= 0) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pFirst = NULL;
      return status;
    }

    if (m_entries_count <= 0) {  // empty cluster
      pFirst = NULL;
      return 0;
    }
  }

  assert(m_entries);

  pFirst = m_entries[0];
  assert(pFirst);

  return 0;  // success
}